

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O3

void gimage::fillGammaMap<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *map,int depth,int from,
               int to,double g)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  
  if (0 < from) {
    uVar2 = 0;
    do {
      if (map->width <= (long)uVar2) break;
      (*map->img[depth])[uVar2] = '\0';
      uVar2 = uVar2 + 1;
    } while ((uint)from != uVar2);
  }
  if (0 < to) {
    uVar2 = 0;
    do {
      if (map->width <= (long)uVar2) break;
      dVar3 = pow((double)((int)uVar2 - from) / (double)(to - from),1.0 / g);
      (*map->img[depth])[uVar2] = (uchar)(int)(dVar3 * 255.0);
      uVar2 = uVar2 + 1;
    } while ((uint)to != uVar2);
  }
  for (lVar1 = (long)to; lVar1 < map->width; lVar1 = lVar1 + 1) {
    (*map->img[depth])[lVar1] = 0xff;
  }
  return;
}

Assistant:

void fillGammaMap(Image<T> &map, int depth, int from, int to, double g)
{
  for (int i=0; i<from && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMinValue());
  }

  for (int i=0; i<to && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, static_cast<T>(map.absMaxValue()*pow(static_cast<double>(i-from)/
                   (to-from), 1.0/g)));
  }

  for (int i=to; i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMaxValue());
  }
}